

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLCellABecLap::applyInhomogNeumannTerm(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  undefined8 uVar1;
  LinOpBCType LVar2;
  LinOpBCType LVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  __uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> _Var10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  FabArray<amrex::FArrayBox> *fabarray_;
  int *piVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  byte bVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  int iVar45;
  long lVar46;
  bool bVar47;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar48;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar49;
  Real fac;
  IntVect hi;
  IntVect low;
  Real fac_2;
  Real fac_3;
  Real fac_4;
  MFIter mfi;
  FArrayBox foo;
  MFItInfo mfi_info;
  ulong local_568;
  ulong local_560;
  long local_550;
  long local_548;
  bool local_53c;
  long local_538;
  Array4<double> local_4f0;
  ulong local_4b0;
  Array4<const_double> local_4a8;
  long local_468;
  long local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  int local_414;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  ulong local_3d0;
  long local_3c8;
  ulong local_3c0;
  uint local_3b8;
  int local_3b4;
  int local_3b0;
  undefined4 local_3ac;
  double local_3a8;
  long local_3a0;
  long local_398;
  ulong local_390;
  long local_388;
  long local_380;
  ulong local_378;
  Array4<const_int> local_370;
  Array4<const_int> local_330;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  Array4<const_double> local_298;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  Array4<const_double> local_240;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  __uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> local_1c8;
  ulong local_1c0;
  long local_1b8;
  FabArray<amrex::FArrayBox> *local_1b0;
  MLCellABecLap *local_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  pointer local_168;
  long local_160;
  ulong local_158;
  long local_150;
  LinOpBCType *local_148;
  LinOpBCType *local_140;
  long local_138;
  long local_130;
  int *local_124;
  uint local_11c;
  int *local_118;
  uint local_110;
  IndexType local_10c;
  MFIter local_108;
  BaseFab<double> local_a8;
  long local_60 [3];
  MFItInfo local_44;
  
  bVar11 = MLLinOp::hasInhomogNeumannBC((MLLinOp *)this);
  bVar12 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar11 || bVar12) {
    fabarray_ = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    local_3b8 = (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[5])(this);
    lVar41 = (long)amrlev;
    local_190 = *(long *)&(this->super_MLCellLinOp).super_MLLinOp.m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar41].
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_1d0 = *(double *)(local_190 + 0x58);
    local_1d8 = *(double *)(local_190 + 0x20);
    local_2e0 = *(double *)(local_190 + 0x38);
    local_2e8 = *(double *)(local_190 + 0x40);
    local_2f0 = *(double *)(local_190 + 0x48);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4c])(this);
    local_3a8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4e])
              (local_60,this,(ulong)(uint)amrlev,0);
    local_108.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    local_108.fabArray = (FabArrayBase *)0x100000000;
    local_108.tile_size.vect[0] = 1;
    local_108.tile_size.vect[1] = 1;
    local_108.tile_size.vect[2] = 0;
    FArrayBox::FArrayBox((FArrayBox *)&local_a8,(Box *)&local_108,1,true,false,(Arena *)0x0);
    local_198 = *(long *)&(this->super_MLCellLinOp).m_maskvals.
                          super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar41].
                          super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
    ;
    local_1b8 = **(long **)&(this->super_MLCellLinOp).m_bcondloc.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar41].
                            super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ;
    local_1c8._M_t.
    super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         (this->super_MLCellLinOp).m_bndry_sol.
         super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar41]._M_t.
         super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>._M_t;
    local_44.do_tiling = false;
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.tilesize.vect[0] = 0;
    local_44.tilesize.vect[1] = 0;
    local_44.tilesize.vect[2] = 0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    local_1b0 = fabarray_;
    local_178 = lVar41;
    MFIter::MFIter(&local_108,&fabarray_->super_FabArrayBase,&local_44);
    if (local_108.currentIndex < local_108.endIndex) {
      local_1c8._M_t.
      super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
      super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
           (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
           ((long)local_1c8._M_t.
                  super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                  .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 8);
      local_1e0 = local_2e8 * local_3a8;
      local_1e8 = local_2e0 * local_3a8;
      local_3a8 = local_3a8 * local_2f0;
      local_1f0 = local_2e8 * local_1e0;
      local_1f8 = local_2e0 * local_1e8;
      local_200 = local_2f0 * local_3a8;
      local_158 = (ulong)local_3b8;
      local_438 = local_60[0];
      lVar41 = local_60[0];
      local_1a8 = this;
      do {
        BATransformer::operator()
                  ((Box *)&local_124,&((local_108.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_108.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_108.currentIndex] * 0x1c +
                          *(long *)&((((local_108.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_4f0,local_1b0,&local_108);
        piVar19 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar19 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        local_1a0 = (long *)((long)*piVar19 * 0x18 + *(long *)(local_1b8 + 0xf0));
        lVar42 = 0;
        do {
          if (lVar41 == 0) {
            local_4a8.begin.y = local_a8.domain.smallend.vect[1];
            local_4a8.begin.x = local_a8.domain.smallend.vect[0];
            local_4a8.p = local_a8.dptr;
            local_4a8.jstride =
                 ((long)local_a8.domain.bigend.vect[0] - (long)local_a8.domain.smallend.vect[0]) + 1
            ;
            local_4a8.kstride =
                 (((long)local_a8.domain.bigend.vect[1] + 1) -
                 (long)local_a8.domain.smallend.vect[1]) * local_4a8.jstride;
            local_4a8.nstride =
                 (((long)local_a8.domain.bigend.vect[2] + 1) -
                 (long)local_a8.domain.smallend.vect[2]) * local_4a8.kstride;
            local_4a8.begin.z = local_a8.domain.smallend.vect[2];
            local_4a8.end._0_8_ =
                 (long)local_a8.domain.bigend.vect[0] + 1U & 0xffffffff |
                 (long)local_a8.domain.bigend.vect[1] + 1 << 0x20;
            local_4a8.end.z = (int)((long)local_a8.domain.bigend.vect[2] + 1);
            local_4a8.ncomp = local_a8.nvar;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_4a8,(FabArray<amrex::FArrayBox> *)local_60[lVar42],&local_108);
          }
          lVar26 = local_198;
          local_330.jstride._0_4_ = local_11c;
          local_330.p = local_124;
          local_370.jstride._0_4_ = local_110;
          local_370.p = local_118;
          iVar13 = *(int *)((long)&local_330.p + lVar42 * 4) + -1;
          *(int *)((long)&local_330.p + lVar42 * 4) = iVar13;
          uVar9 = (uint)local_330.jstride;
          *(int *)((long)&local_370.p + lVar42 * 4) = iVar13;
          uVar4 = (uint)local_370.jstride;
          iVar6 = (int)local_330.p;
          uVar32 = (ulong)local_330.p & 0xffffffff;
          iVar7 = local_330.p._4_4_;
          local_450 = (ulong)local_370.p & 0xffffffff;
          iVar13 = local_370.p._4_4_;
          local_330.jstride._0_4_ = local_11c;
          local_330.p = local_124;
          local_370.jstride._0_4_ = local_110;
          local_370.p = local_118;
          local_298.p = (double *)(CONCAT44(local_10c.itype >> 1,local_10c.itype) & 0x100000001);
          local_298.jstride._0_4_ = local_10c.itype >> 2 & 1;
          iVar14 = (~*(uint *)((long)&local_298.p + lVar42 * 4) & 1) +
                   *(int *)((long)&local_370.p + lVar42 * 4);
          *(int *)((long)&local_330.p + lVar42 * 4) = iVar14;
          *(int *)((long)&local_370.p + lVar42 * 4) = iVar14;
          uVar5 = (uint)local_370.jstride;
          local_3c0 = (ulong)(int)local_330.p;
          iVar8 = local_330.p._4_4_;
          local_4b0 = (ulong)(uint)local_330.jstride;
          local_458 = (ulong)local_370.p & 0xffffffff;
          iVar14 = local_370.p._4_4_;
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_330,(FabArray<amrex::Mask> *)(local_198 + lVar42 * 0x180),&local_108);
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_370,(FabArray<amrex::Mask> *)(lVar26 + lVar42 * 0x180 + 0x480),
                     &local_108);
          _Var10._M_t.
          super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
          super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
               (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
               (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)local_1c8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_298,
                     (FabArray<amrex::FArrayBox> *)
                     &(((InterpBndryData *)
                       local_1c8._M_t.
                       super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                       .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl)->
                      super_BndryData).super_BndryRegister.bndry[lVar42 + -1].m_mf.
                      super_FabArray<amrex::FArrayBox>.os_temp,&local_108);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_240,
                     (FabArray<amrex::FArrayBox> *)
                     &(((InterpBndryData *)
                       _Var10._M_t.
                       super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                       .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl)->
                      super_BndryData).super_BndryRegister.bndry[lVar42 + 2].m_mf.
                      super_FabArray<amrex::FArrayBox>.os_temp,&local_108);
          uVar33 = (uint)local_450;
          if (iVar6 < *(int *)(local_190 + 0xac)) {
            local_53c = false;
          }
          else if ((((iVar7 < *(int *)(local_190 + 0xb0)) ||
                    ((int)uVar9 < *(int *)(local_190 + 0xb4))) ||
                   (*(int *)(local_190 + 0xb8) < (int)uVar33)) ||
                  (*(int *)(local_190 + 0xbc) < iVar13)) {
            local_53c = false;
          }
          else {
            local_53c = (int)uVar4 <= *(int *)(local_190 + 0xc0);
          }
          local_3d0 = local_3c0 & 0xffffffff;
          uVar15 = (uint)local_458;
          if ((((int)local_3c0 < *(int *)(local_190 + 0xac)) || (iVar8 < *(int *)(local_190 + 0xb0))
              ) || (((int)local_4b0 < *(int *)(local_190 + 0xb4) ||
                    ((*(int *)(local_190 + 0xb8) < (int)uVar15 ||
                     (*(int *)(local_190 + 0xbc) < iVar14)))))) {
            local_3ac = 0;
          }
          else {
            local_3ac = CONCAT31((int3)(local_3c0 >> 8),(int)uVar5 <= *(int *)(local_190 + 0xc0));
          }
          bVar22 = (byte)local_3ac;
          if ((local_53c & bVar22) == 0 && 0 < (int)local_3b8) {
            lVar26 = (long)iVar6;
            local_2a8 = (long)iVar7;
            local_2b0 = (long)(int)uVar9;
            local_398 = (long)iVar8;
            bVar11 = lVar41 == 0;
            local_148 = ((local_1a8->super_MLCellLinOp).super_MLLinOp.m_lobc_orig.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar42;
            bVar39 = (local_1a8->super_MLCellLinOp).m_has_metric_term ^ 1;
            local_140 = ((local_1a8->super_MLCellLinOp).super_MLLinOp.m_hibc_orig.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar42;
            local_460 = lVar26 * 8;
            local_380 = lVar26 * 4;
            local_130 = ~uVar33 + uVar32;
            uVar16 = (uVar33 + 1) - iVar6;
            local_378 = (ulong)uVar16;
            uVar23 = (uVar33 + 1) - iVar6;
            local_1c0 = (ulong)uVar23;
            local_138 = ~uVar15 + local_3d0;
            iVar40 = (uVar15 + 1) - (int)local_3c0;
            uVar24 = (uVar15 + 1) - (int)local_3c0;
            local_2a0 = (ulong)uVar24;
            local_180 = (long)local_108.currentIndex * 4;
            local_2b8 = (long)(int)local_4b0;
            local_150 = *local_1a0;
            local_168 = (local_1a8->super_MLCellLinOp).m_robin_bcval.
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_404 = iVar13 + 1;
            local_40c = uVar4 + 1;
            local_408 = iVar14 + 1;
            local_410 = uVar5 + 1;
            local_3b0 = iVar7 + 1;
            local_244 = iVar6 + 1;
            local_248 = iVar6 + 1;
            local_254 = uVar9 + 1;
            local_468 = local_3c0 * 8;
            local_414 = iVar8 + -1;
            local_388 = local_3c0 * 4;
            local_3b4 = (int)local_4b0 + -1;
            local_160 = local_2a8 + 1;
            local_2c0 = local_2a8 * 8;
            local_2c8 = local_2b0 * 8;
            local_188 = local_2b0 + 1;
            local_2d0 = local_398 * 8;
            local_2d8 = local_2b8 * 8;
            local_24c = (int)local_3c0 + -1;
            local_250 = (int)local_3c0 + -1;
            local_420 = 8;
            local_428 = 0x10;
            local_430 = 0;
            local_538 = 0;
            uVar38 = 0;
            do {
              local_390 = uVar38;
              lVar34 = local_150 + local_390 * 0x18;
              iVar18 = *(int *)(lVar34 + 0xc + lVar42 * 4);
              LVar2 = local_148[local_390 * 3];
              local_440 = CONCAT44(local_440._4_4_,LVar2);
              iVar25 = (int)lVar42;
              if (LVar2 == inhomogNeumann && local_53c == false) {
                iVar31 = *(int *)(lVar34 + lVar42 * 4);
                if (iVar25 == 1) {
                  if ((bVar39 & 1) == 0 && bVar11) {
                    uVar17 = uVar9;
                    if ((int)uVar9 <= (int)uVar4) {
                      do {
                        if (iVar7 <= iVar13) {
                          lVar34 = (long)(int)uVar17;
                          iVar30 = local_3b0;
                          iVar45 = iVar7;
                          do {
                            if (iVar6 <= (int)uVar33) {
                              lVar20 = local_4f0.nstride * local_538 +
                                       (iVar30 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar34 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_460;
                              lVar21 = 0;
                              do {
                                if ((iVar31 == 0x66) &&
                                   (local_330.p
                                    [lVar26 + (((lVar34 - local_330.begin.z) * local_330.kstride +
                                               ((long)iVar45 - (long)local_330.begin.y) *
                                               CONCAT44(local_330.jstride._4_4_,
                                                        (uint)local_330.jstride) + lVar21) -
                                              (long)local_330.begin.x)] == 2)) {
                                  *(double *)((long)local_4f0.p + lVar21 * 8 + lVar20) =
                                       *(double *)((long)local_4f0.p + lVar21 * 8 + lVar20) -
                                       (((double)(iVar6 + (int)lVar21) + 0.5) * local_1d8 +
                                       local_1d0) * local_1e0 *
                                       *(double *)
                                        ((long)local_298.p +
                                        lVar21 * 8 +
                                        local_298.nstride * local_538 +
                                        ((long)iVar45 - (long)local_298.begin.y) *
                                        CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) *
                                        8 + (lVar34 - local_298.begin.z) * local_298.kstride * 8 +
                                        (long)local_298.begin.x * -8 + local_460);
                                }
                                lVar21 = lVar21 + 1;
                                lVar41 = local_438;
                              } while ((int)local_130 + (int)lVar21 != 0);
                            }
                            iVar30 = iVar30 + 1;
                            bVar47 = iVar45 != iVar13;
                            iVar45 = iVar45 + 1;
                          } while (bVar47);
                        }
                        bVar47 = uVar17 != uVar4;
                        uVar17 = uVar17 + 1;
                      } while (bVar47);
                    }
                  }
                  else {
                    uVar17 = uVar9;
                    if ((int)uVar9 <= (int)uVar4) {
                      do {
                        if (iVar7 <= iVar13) {
                          lVar34 = (long)(int)uVar17;
                          iVar30 = local_3b0;
                          iVar45 = iVar7;
                          do {
                            if (iVar6 <= (int)uVar33) {
                              lVar20 = local_4f0.nstride * local_538 +
                                       (iVar30 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar34 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_460;
                              lVar21 = 0;
                              do {
                                if ((iVar31 == 0x66) &&
                                   (local_330.p
                                    [lVar26 + (((lVar34 - local_330.begin.z) * local_330.kstride +
                                               ((long)iVar45 - (long)local_330.begin.y) *
                                               CONCAT44(local_330.jstride._4_4_,
                                                        (uint)local_330.jstride) + lVar21) -
                                              (long)local_330.begin.x)] == 2)) {
                                  uVar48 = 0;
                                  uVar49 = 0x3ff00000;
                                  if (local_438 != 0) {
                                    uVar1 = *(undefined8 *)
                                             ((long)local_4a8.p +
                                             lVar21 * 8 +
                                             local_4a8.nstride * local_538 +
                                             (iVar30 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                             (lVar34 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                             (long)local_4a8.begin.x * -8 + local_460);
                                    uVar48 = (undefined4)uVar1;
                                    uVar49 = (undefined4)((ulong)uVar1 >> 0x20);
                                  }
                                  *(double *)((long)local_4f0.p + lVar21 * 8 + lVar20) =
                                       *(double *)((long)local_4f0.p + lVar21 * 8 + lVar20) -
                                       (double)CONCAT44(uVar49,uVar48) * local_1e0 *
                                       *(double *)
                                        ((long)local_298.p +
                                        lVar21 * 8 +
                                        local_298.nstride * local_538 +
                                        ((long)iVar45 - (long)local_298.begin.y) *
                                        CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) *
                                        8 + (lVar34 - local_298.begin.z) * local_298.kstride * 8 +
                                        (long)local_298.begin.x * -8 + local_460);
                                }
                                lVar21 = lVar21 + 1;
                                lVar41 = local_438;
                              } while (uVar16 != (uint)lVar21);
                            }
                            iVar30 = iVar30 + 1;
                            bVar47 = iVar45 != iVar13;
                            iVar45 = iVar45 + 1;
                          } while (bVar47);
                        }
                        bVar47 = uVar17 != uVar4;
                        uVar17 = uVar17 + 1;
                      } while (bVar47);
                    }
                  }
                }
                else if (iVar25 == 0) {
                  uVar17 = uVar9;
                  if ((int)uVar9 <= (int)uVar4) {
                    do {
                      if (iVar7 <= iVar13) {
                        lVar41 = (long)(int)uVar17;
                        iVar30 = iVar7;
                        do {
                          if (iVar6 <= (int)uVar33) {
                            lVar20 = (long)iVar30;
                            lVar34 = (lVar20 - local_4f0.begin.y) * local_4f0.jstride;
                            lVar21 = (lVar41 - local_4f0.begin.z) * local_4f0.kstride;
                            lVar37 = 0;
                            do {
                              if ((iVar31 == 0x66) &&
                                 (local_330.p
                                  [lVar26 + (((lVar41 - local_330.begin.z) * local_330.kstride +
                                             (lVar20 - local_330.begin.y) *
                                             CONCAT44(local_330.jstride._4_4_,
                                                      (uint)local_330.jstride) + lVar37) -
                                            (long)local_330.begin.x)] == 2)) {
                                uVar48 = 0;
                                uVar49 = 0x3ff00000;
                                if (local_438 != 0) {
                                  uVar48 = SUB84(local_4a8.p
                                                 [(lVar20 - local_4a8.begin.y) * local_4a8.jstride +
                                                  (lVar41 - local_4a8.begin.z) * local_4a8.kstride +
                                                  local_4a8.nstride * local_390 +
                                                  (long)((int)lVar37 +
                                                        (local_244 - local_4a8.begin.x))],0);
                                  uVar49 = (undefined4)
                                           ((ulong)local_4a8.p
                                                   [(lVar20 - local_4a8.begin.y) * local_4a8.jstride
                                                    + (lVar41 - local_4a8.begin.z) *
                                                      local_4a8.kstride +
                                                      local_4a8.nstride * local_390 +
                                                      (long)((int)lVar37 +
                                                            (local_244 - local_4a8.begin.x))] >>
                                           0x20);
                                }
                                lVar43 = (long)((local_248 - local_4f0.begin.x) + (int)lVar37);
                                local_4f0.p
                                [lVar34 + lVar21 + local_4f0.nstride * local_390 + lVar43] =
                                     local_4f0.p
                                     [lVar34 + lVar21 + local_4f0.nstride * local_390 + lVar43] -
                                     (double)CONCAT44(uVar49,uVar48) * local_1e8 *
                                     *(double *)
                                      ((long)local_298.p +
                                      lVar37 * 8 +
                                      local_298.nstride * local_538 +
                                      (lVar20 - local_298.begin.y) *
                                      CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) * 8
                                      + (lVar41 - local_298.begin.z) * local_298.kstride * 8 +
                                      (long)local_298.begin.x * -8 + local_460);
                              }
                              lVar37 = lVar37 + 1;
                            } while (uVar23 != (uint)lVar37);
                          }
                          bVar47 = iVar30 != iVar13;
                          iVar30 = iVar30 + 1;
                        } while (bVar47);
                      }
                      bVar47 = uVar17 != uVar4;
                      lVar41 = local_438;
                      uVar17 = uVar17 + 1;
                    } while (bVar47);
                  }
                }
                else {
                  uVar17 = uVar9;
                  iVar30 = local_254;
                  if ((int)uVar9 <= (int)uVar4) {
                    do {
                      if (iVar7 <= iVar13) {
                        iVar45 = iVar7;
                        do {
                          if (iVar6 <= (int)uVar33) {
                            lVar20 = (long)iVar45;
                            lVar34 = local_4f0.nstride * local_538 +
                                     (iVar30 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                     (lVar20 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                     (long)local_4f0.begin.x * -8 + local_460;
                            lVar21 = 0;
                            do {
                              if ((iVar31 == 0x66) &&
                                 (local_330.p
                                  [lVar26 + ((((long)(int)uVar17 - (long)local_330.begin.z) *
                                              local_330.kstride +
                                             (lVar20 - local_330.begin.y) *
                                             CONCAT44(local_330.jstride._4_4_,
                                                      (uint)local_330.jstride) + lVar21) -
                                            (long)local_330.begin.x)] == 2)) {
                                uVar48 = 0;
                                uVar49 = 0x3ff00000;
                                if (local_438 != 0) {
                                  uVar1 = *(undefined8 *)
                                           ((long)local_4a8.p +
                                           lVar21 * 8 +
                                           local_4a8.nstride * local_538 +
                                           (iVar30 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                           (lVar20 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                           (long)local_4a8.begin.x * -8 + local_460);
                                  uVar48 = (undefined4)uVar1;
                                  uVar49 = (undefined4)((ulong)uVar1 >> 0x20);
                                }
                                *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34) =
                                     *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34) -
                                     (double)CONCAT44(uVar49,uVar48) * local_3a8 *
                                     *(double *)
                                      ((long)local_298.p +
                                      lVar21 * 8 +
                                      local_298.nstride * local_538 +
                                      (lVar20 - local_298.begin.y) *
                                      CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) * 8
                                      + ((long)(int)uVar17 - (long)local_298.begin.z) *
                                        local_298.kstride * 8 + (long)local_298.begin.x * -8 +
                                      local_460);
                              }
                              lVar21 = lVar21 + 1;
                              lVar41 = local_438;
                            } while (uVar23 != (uint)lVar21);
                          }
                          bVar47 = iVar45 != iVar13;
                          iVar45 = iVar45 + 1;
                        } while (bVar47);
                      }
                      bVar47 = uVar17 != uVar4;
                      uVar17 = uVar17 + 1;
                      iVar30 = iVar30 + 1;
                    } while (bVar47);
                  }
                }
              }
              LVar3 = local_140[local_390 * 3];
              local_3a0 = CONCAT44(local_3a0._4_4_,LVar3);
              if (LVar3 == inhomogNeumann && bVar22 == 0) {
                if (iVar25 == 1) {
                  if ((bVar39 & 1) == 0 && bVar11) {
                    uVar38 = local_4b0 & 0xffffffff;
                    if ((int)local_4b0 <= (int)uVar5) {
                      do {
                        uVar17 = (uint)uVar38;
                        if (iVar8 <= iVar14) {
                          lVar41 = (long)(int)uVar17;
                          iVar31 = local_414;
                          iVar30 = iVar8;
                          do {
                            if ((int)local_3c0 <= (int)uVar15) {
                              lVar34 = local_4f0.nstride * local_538 +
                                       (iVar31 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar41 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_468;
                              lVar20 = 0;
                              do {
                                if ((iVar18 == 0x66) &&
                                   (local_370.p
                                    [local_3c0 +
                                     (((lVar41 - local_370.begin.z) * local_370.kstride +
                                      ((long)iVar30 - (long)local_370.begin.y) *
                                      CONCAT44(local_370.jstride._4_4_,(uint)local_370.jstride) +
                                      lVar20) - (long)local_370.begin.x)] == 2)) {
                                  *(double *)((long)local_4f0.p + lVar20 * 8 + lVar34) =
                                       (((double)((int)local_3c0 + (int)lVar20) + 0.5) * local_1d8 +
                                       local_1d0) * local_1e0 *
                                       *(double *)
                                        ((long)local_240.p +
                                        lVar20 * 8 +
                                        local_240.nstride * local_538 +
                                        ((long)iVar30 - (long)local_240.begin.y) * local_240.jstride
                                        * 8 + (lVar41 - local_240.begin.z) * local_240.kstride * 8 +
                                        (long)local_240.begin.x * -8 + local_468) +
                                       *(double *)((long)local_4f0.p + lVar20 * 8 + lVar34);
                                }
                                lVar20 = lVar20 + 1;
                              } while ((int)local_138 + (int)lVar20 != 0);
                            }
                            iVar31 = iVar31 + 1;
                            bVar47 = iVar30 != iVar14;
                            iVar30 = iVar30 + 1;
                          } while (bVar47);
                        }
                        uVar38 = (ulong)(uVar17 + 1);
                      } while (uVar17 != uVar5);
                    }
                  }
                  else {
                    local_568 = local_4b0 & 0xffffffff;
                    if ((int)local_4b0 <= (int)uVar5) {
                      do {
                        if (iVar8 <= iVar14) {
                          lVar41 = (long)(int)(uint)local_568;
                          iVar31 = local_414;
                          iVar30 = iVar8;
                          do {
                            if ((int)local_3c0 <= (int)uVar15) {
                              lVar20 = (long)iVar30;
                              lVar34 = local_4f0.nstride * local_538 +
                                       (iVar31 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar41 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_468;
                              lVar21 = 0;
                              do {
                                if ((iVar18 == 0x66) &&
                                   (local_370.p
                                    [local_3c0 +
                                     (((lVar41 - local_370.begin.z) * local_370.kstride +
                                      (lVar20 - local_370.begin.y) *
                                      CONCAT44(local_370.jstride._4_4_,(uint)local_370.jstride) +
                                      lVar21) - (long)local_370.begin.x)] == 2)) {
                                  uVar48 = 0;
                                  uVar49 = 0x3ff00000;
                                  if (local_438 != 0) {
                                    uVar1 = *(undefined8 *)
                                             ((long)local_4a8.p +
                                             lVar21 * 8 +
                                             local_4a8.nstride * local_538 +
                                             (lVar20 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                             (lVar41 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                             (long)local_4a8.begin.x * -8 + local_468);
                                    uVar48 = (undefined4)uVar1;
                                    uVar49 = (undefined4)((ulong)uVar1 >> 0x20);
                                  }
                                  *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34) =
                                       (double)CONCAT44(uVar49,uVar48) * local_1e0 *
                                       *(double *)
                                        ((long)local_240.p +
                                        lVar21 * 8 +
                                        local_240.nstride * local_538 +
                                        (lVar20 - local_240.begin.y) * local_240.jstride * 8 +
                                        (lVar41 - local_240.begin.z) * local_240.kstride * 8 +
                                        (long)local_240.begin.x * -8 + local_468) +
                                       *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34);
                                }
                                lVar21 = lVar21 + 1;
                              } while (iVar40 != (int)lVar21);
                            }
                            iVar31 = iVar31 + 1;
                            bVar47 = iVar30 != iVar14;
                            iVar30 = iVar30 + 1;
                          } while (bVar47);
                        }
                        bVar47 = (uint)local_568 != uVar5;
                        local_568 = (ulong)((uint)local_568 + 1);
                      } while (bVar47);
                    }
                  }
                }
                else if (iVar25 == 0) {
                  if ((int)local_4b0 <= (int)uVar5) {
                    local_568 = local_4b0;
                    do {
                      if (iVar8 <= iVar14) {
                        lVar34 = (long)(int)(uint)local_568;
                        iVar31 = iVar8;
                        do {
                          if ((int)local_3c0 <= (int)uVar15) {
                            lVar20 = (long)iVar31;
                            lVar43 = (lVar20 - local_4f0.begin.y) * local_4f0.jstride;
                            lVar21 = (lVar34 - local_4f0.begin.z) * local_4f0.kstride;
                            lVar37 = 0;
                            do {
                              if ((iVar18 == 0x66) &&
                                 (local_370.p
                                  [local_3c0 +
                                   (((lVar34 - local_370.begin.z) * local_370.kstride +
                                    (lVar20 - local_370.begin.y) *
                                    CONCAT44(local_370.jstride._4_4_,(uint)local_370.jstride) +
                                    lVar37) - (long)local_370.begin.x)] == 2)) {
                                uVar48 = 0;
                                uVar49 = 0x3ff00000;
                                if (lVar41 != 0) {
                                  uVar1 = *(undefined8 *)
                                           ((long)local_4a8.p +
                                           lVar37 * 8 +
                                           local_4a8.nstride * local_538 +
                                           (lVar20 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                           (lVar34 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                           (long)local_4a8.begin.x * -8 + local_468);
                                  uVar48 = (undefined4)uVar1;
                                  uVar49 = (undefined4)((ulong)uVar1 >> 0x20);
                                }
                                lVar46 = (long)((local_24c - local_4f0.begin.x) + (int)lVar37);
                                local_4f0.p
                                [lVar43 + lVar21 + local_4f0.nstride * local_390 + lVar46] =
                                     (double)CONCAT44(uVar49,uVar48) * local_1e8 *
                                     *(double *)
                                      ((long)local_240.p +
                                      lVar37 * 8 +
                                      local_240.nstride * local_538 +
                                      (lVar20 - local_240.begin.y) * local_240.jstride * 8 +
                                      (lVar34 - local_240.begin.z) * local_240.kstride * 8 +
                                      (long)local_240.begin.x * -8 + local_468) +
                                     local_4f0.p
                                     [lVar43 + lVar21 + local_4f0.nstride * local_390 + lVar46];
                              }
                              lVar37 = lVar37 + 1;
                            } while (iVar40 != (int)lVar37);
                          }
                          bVar47 = iVar31 != iVar14;
                          iVar31 = iVar31 + 1;
                        } while (bVar47);
                      }
                      bVar47 = (uint)local_568 != uVar5;
                      local_568 = (ulong)((uint)local_568 + 1);
                    } while (bVar47);
                  }
                }
                else if ((int)local_4b0 <= (int)uVar5) {
                  local_560 = local_4b0;
                  iVar31 = local_3b4;
                  do {
                    if (iVar8 <= iVar14) {
                      lVar41 = (long)(int)(uint)local_560;
                      iVar30 = iVar8;
                      do {
                        if ((int)local_3c0 <= (int)uVar15) {
                          lVar20 = (long)iVar30;
                          lVar34 = local_4f0.nstride * local_538 +
                                   (iVar31 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                   (lVar20 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                   (long)local_4f0.begin.x * -8 + local_468;
                          lVar21 = 0;
                          do {
                            if ((iVar18 == 0x66) &&
                               (local_370.p
                                [local_3c0 +
                                 (((lVar41 - local_370.begin.z) * local_370.kstride +
                                  (lVar20 - local_370.begin.y) *
                                  CONCAT44(local_370.jstride._4_4_,(uint)local_370.jstride) + lVar21
                                  ) - (long)local_370.begin.x)] == 2)) {
                              uVar48 = 0;
                              uVar49 = 0x3ff00000;
                              if (local_438 != 0) {
                                uVar1 = *(undefined8 *)
                                         ((long)local_4a8.p +
                                         lVar21 * 8 +
                                         local_4a8.nstride * local_538 +
                                         (lVar20 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                         (lVar41 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                         (long)local_4a8.begin.x * -8 + local_468);
                                uVar48 = (undefined4)uVar1;
                                uVar49 = (undefined4)((ulong)uVar1 >> 0x20);
                              }
                              *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34) =
                                   (double)CONCAT44(uVar49,uVar48) * local_3a8 *
                                   *(double *)
                                    ((long)local_240.p +
                                    lVar21 * 8 +
                                    local_240.nstride * local_538 +
                                    (lVar20 - local_240.begin.y) * local_240.jstride * 8 +
                                    (lVar41 - local_240.begin.z) * local_240.kstride * 8 +
                                    (long)local_240.begin.x * -8 + local_468) +
                                   *(double *)((long)local_4f0.p + lVar21 * 8 + lVar34);
                            }
                            lVar21 = lVar21 + 1;
                          } while (iVar40 != (int)lVar21);
                        }
                        bVar47 = iVar30 != iVar14;
                        iVar30 = iVar30 + 1;
                      } while (bVar47);
                    }
                    iVar31 = iVar31 + 1;
                    bVar47 = (uint)local_560 != uVar5;
                    local_560 = (ulong)((uint)local_560 + 1);
                  } while (bVar47);
                }
              }
              if (bVar12) {
                piVar19 = &local_108.currentIndex;
                if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                  piVar19 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + local_108.currentIndex;
                }
                lVar41 = *(long *)(*(long *)((long)local_168[local_178]._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                            + 0x108) + (long)*piVar19 * 8);
                local_3d8 = *(long *)(lVar41 + 0x10);
                local_3e0 = (long)*(int *)(lVar41 + 0x18);
                local_3f8 = (long)*(int *)(lVar41 + 0x1c);
                local_400 = (long)*(int *)(lVar41 + 0x20);
                local_3e8 = (long)((*(int *)(lVar41 + 0x24) - *(int *)(lVar41 + 0x18)) + 1);
                local_3f0 = (long)((*(int *)(lVar41 + 0x28) - *(int *)(lVar41 + 0x1c)) + 1);
                lVar41 = (long)((*(int *)(lVar41 + 0x2c) - *(int *)(lVar41 + 0x20)) + 1);
                if (LVar2 == Robin && local_53c == false) {
                  if (iVar25 == 1) {
                    if ((int)uVar9 <= (int)uVar4) {
                      local_550 = local_3d8 + local_460;
                      local_568 = ((local_420 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      lVar21 = local_3f0 * local_3e8 * 8;
                      lVar34 = local_3e8 * 8;
                      local_560 = ((local_430 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      local_550 = ((local_428 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      lVar20 = local_2b0;
                      do {
                        if (iVar7 <= iVar13) {
                          lVar46 = (long)local_4a8.p +
                                   local_4a8.nstride * local_538 +
                                   (local_160 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                   (lVar20 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                   (long)local_4a8.begin.x * -8 + local_460;
                          lVar29 = (long)local_4f0.p +
                                   local_4f0.nstride * local_538 +
                                   (local_160 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                   (lVar20 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                   (long)local_4f0.begin.x * -8 + local_460;
                          lVar37 = local_2a8;
                          uVar38 = local_568;
                          lVar43 = local_550;
                          uVar44 = local_560;
                          do {
                            if (iVar6 <= (int)uVar33) {
                              lVar36 = 0;
                              do {
                                *(double *)(lVar29 + lVar36 * 8) =
                                     *(double *)(lVar46 + lVar36 * 8) * local_1f0 *
                                     (*(double *)(lVar43 + lVar36 * 8) /
                                     (*(double *)(uVar38 + lVar36 * 8) * local_2e8 +
                                     *(double *)(uVar44 + lVar36 * 8) * 0.5)) +
                                     *(double *)(lVar29 + lVar36 * 8);
                                lVar36 = lVar36 + 1;
                              } while (uVar16 != (uint)lVar36);
                            }
                            lVar37 = lVar37 + 1;
                            lVar46 = lVar46 + local_4a8.jstride * 8;
                            uVar38 = uVar38 + lVar34;
                            uVar44 = uVar44 + lVar34;
                            lVar43 = lVar43 + lVar34;
                            lVar29 = lVar29 + local_4f0.jstride * 8;
                          } while (local_404 != (int)lVar37);
                        }
                        lVar20 = lVar20 + 1;
                        local_568 = local_568 + lVar21;
                        local_560 = local_560 + lVar21;
                        local_550 = local_550 + lVar21;
                      } while (local_40c != (int)lVar20);
                    }
                  }
                  else if (iVar25 == 0) {
                    if ((int)uVar9 <= (int)uVar4) {
                      local_550 = local_3d8 + local_460;
                      local_568 = ((local_420 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      lVar21 = local_3f0 * local_3e8 * 8;
                      lVar34 = local_3e8 * 8;
                      local_560 = ((local_430 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      local_550 = ((local_428 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                   local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_550;
                      lVar20 = local_2b0;
                      do {
                        if (iVar7 <= iVar13) {
                          lVar29 = (long)local_4f0.p +
                                   local_4f0.nstride * local_538 +
                                   (local_2a8 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                   (lVar20 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                   (long)local_4f0.begin.x * -8 + local_460 + 8;
                          lVar46 = (long)local_4a8.p +
                                   local_4a8.nstride * local_538 +
                                   (local_2a8 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                   (lVar20 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                   (long)local_4a8.begin.x * -8 + local_460 + 8;
                          uVar38 = local_568;
                          lVar37 = local_2a8;
                          lVar43 = local_550;
                          uVar44 = local_560;
                          do {
                            if (iVar6 <= (int)uVar33) {
                              lVar36 = 0;
                              do {
                                *(double *)(lVar29 + lVar36 * 8) =
                                     *(double *)(lVar46 + lVar36 * 8) * local_1f8 *
                                     (*(double *)(lVar43 + lVar36 * 8) /
                                     (*(double *)(uVar38 + lVar36 * 8) * local_2e0 +
                                     *(double *)(uVar44 + lVar36 * 8) * 0.5)) +
                                     *(double *)(lVar29 + lVar36 * 8);
                                lVar36 = lVar36 + 1;
                              } while (uVar16 != (uint)lVar36);
                            }
                            lVar37 = lVar37 + 1;
                            uVar38 = uVar38 + lVar34;
                            uVar44 = uVar44 + lVar34;
                            lVar43 = lVar43 + lVar34;
                            lVar29 = lVar29 + local_4f0.jstride * 8;
                            lVar46 = lVar46 + local_4a8.jstride * 8;
                          } while (local_404 != (int)lVar37);
                        }
                        lVar20 = lVar20 + 1;
                        local_568 = local_568 + lVar21;
                        local_560 = local_560 + lVar21;
                        local_550 = local_550 + lVar21;
                      } while (local_40c != (int)lVar20);
                    }
                  }
                  else if ((int)uVar9 <= (int)uVar4) {
                    local_550 = local_460 + local_3d8;
                    local_568 = ((local_420 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                 local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_550;
                    local_440 = local_3f0 * local_3e8 * 8;
                    lVar34 = local_3e8 * 8;
                    local_560 = ((local_430 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                 local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_550;
                    local_550 = ((local_428 * lVar41 + local_2c8 + local_400 * -8) * local_3f0 +
                                 local_2c0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_550;
                    lVar20 = local_188;
                    lVar21 = local_2b0;
                    do {
                      if (iVar7 <= iVar13) {
                        lVar46 = (long)local_4a8.p +
                                 local_4a8.nstride * local_538 +
                                 (local_2a8 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                 (lVar20 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                 (long)local_4a8.begin.x * -8 + local_460;
                        lVar29 = (long)local_4f0.p +
                                 local_4f0.nstride * local_538 +
                                 (local_2a8 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                 (lVar20 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                 (long)local_4f0.begin.x * -8 + local_460;
                        uVar38 = local_568;
                        lVar37 = local_2a8;
                        lVar43 = local_550;
                        uVar44 = local_560;
                        do {
                          if (iVar6 <= (int)uVar33) {
                            lVar36 = 0;
                            do {
                              *(double *)(lVar29 + lVar36 * 8) =
                                   *(double *)(lVar46 + lVar36 * 8) * local_200 *
                                   (*(double *)(lVar43 + lVar36 * 8) /
                                   (*(double *)(uVar38 + lVar36 * 8) * local_2f0 +
                                   *(double *)(uVar44 + lVar36 * 8) * 0.5)) +
                                   *(double *)(lVar29 + lVar36 * 8);
                              lVar36 = lVar36 + 1;
                            } while (uVar16 != (uint)lVar36);
                          }
                          lVar37 = lVar37 + 1;
                          lVar46 = lVar46 + local_4a8.jstride * 8;
                          uVar38 = uVar38 + lVar34;
                          uVar44 = uVar44 + lVar34;
                          lVar43 = lVar43 + lVar34;
                          lVar29 = lVar29 + local_4f0.jstride * 8;
                        } while (local_404 != (int)lVar37);
                      }
                      lVar21 = lVar21 + 1;
                      lVar20 = lVar20 + 1;
                      local_568 = local_568 + local_440;
                      local_560 = local_560 + local_440;
                      local_550 = local_550 + local_440;
                    } while (local_40c != (int)lVar21);
                  }
                }
                if (LVar3 == Robin && bVar22 == 0) {
                  if (iVar25 == 1) {
                    if ((int)local_4b0 <= (int)uVar5) {
                      local_548 = local_3d8 + local_468;
                      local_568 = ((local_420 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      lVar20 = local_3f0 * local_3e8 * 8;
                      lVar34 = local_3e8 * 8;
                      local_560 = ((local_430 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      local_548 = ((lVar41 * local_428 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      lVar41 = local_2b8;
                      do {
                        if (iVar8 <= iVar14) {
                          lVar43 = (long)local_4a8.p +
                                   local_4a8.nstride * local_538 +
                                   (local_398 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                   (lVar41 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                   (long)local_4a8.begin.x * -8 + local_468;
                          iVar18 = local_414 - local_4f0.begin.y;
                          uVar38 = local_568;
                          uVar44 = local_560;
                          lVar21 = local_548;
                          lVar37 = local_398;
                          do {
                            if ((int)local_3c0 <= (int)uVar15) {
                              lVar46 = (long)iVar18 * local_4f0.jstride * 8 +
                                       local_4f0.nstride * local_538 +
                                       (lVar41 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_468;
                              lVar29 = 0;
                              do {
                                *(double *)((long)local_4f0.p + lVar29 * 8 + lVar46) =
                                     *(double *)(lVar43 + lVar29 * 8) * local_1f0 *
                                     (*(double *)(lVar21 + lVar29 * 8) /
                                     (*(double *)(uVar38 + lVar29 * 8) * local_2e8 +
                                     *(double *)(uVar44 + lVar29 * 8) * 0.5)) +
                                     *(double *)((long)local_4f0.p + lVar29 * 8 + lVar46);
                                lVar29 = lVar29 + 1;
                              } while (uVar24 != (uint)lVar29);
                            }
                            lVar37 = lVar37 + 1;
                            lVar43 = lVar43 + local_4a8.jstride * 8;
                            uVar38 = uVar38 + lVar34;
                            uVar44 = uVar44 + lVar34;
                            lVar21 = lVar21 + lVar34;
                            iVar18 = iVar18 + 1;
                          } while (local_408 != (int)lVar37);
                        }
                        lVar41 = lVar41 + 1;
                        local_568 = local_568 + lVar20;
                        local_560 = local_560 + lVar20;
                        local_548 = local_548 + lVar20;
                      } while (local_410 != (int)lVar41);
                    }
                  }
                  else if (iVar25 == 0) {
                    if ((int)local_4b0 <= (int)uVar5) {
                      local_548 = local_3d8 + local_468;
                      local_440 = ((local_420 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      lVar20 = local_3f0 * local_3e8 * 8;
                      lVar34 = local_3e8 * 8;
                      local_3a0 = ((local_430 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      local_548 = ((lVar41 * local_428 + local_2d8 + local_400 * -8) * local_3f0 +
                                   local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                  local_548;
                      lVar41 = local_2b8;
                      do {
                        if (iVar8 <= iVar14) {
                          lVar36 = (lVar41 - local_4f0.begin.z) * local_4f0.kstride;
                          lVar29 = (long)local_4a8.p +
                                   local_4a8.nstride * local_538 +
                                   (local_398 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                   (lVar41 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                   (long)local_4a8.begin.x * -8 + local_468;
                          lVar21 = local_398;
                          lVar37 = local_3a0;
                          lVar43 = local_548;
                          lVar46 = local_440;
                          do {
                            if ((int)local_3c0 <= (int)uVar15) {
                              lVar27 = (lVar21 - local_4f0.begin.y) * local_4f0.jstride;
                              lVar35 = 0;
                              do {
                                lVar28 = (long)((local_250 - local_4f0.begin.x) + (int)lVar35);
                                local_4f0.p
                                [lVar36 + local_4f0.nstride * local_390 + lVar27 + lVar28] =
                                     *(double *)(lVar29 + lVar35 * 8) * local_1f8 *
                                     (*(double *)(lVar43 + lVar35 * 8) /
                                     (*(double *)(lVar46 + lVar35 * 8) * local_2e0 +
                                     *(double *)(lVar37 + lVar35 * 8) * 0.5)) +
                                     local_4f0.p
                                     [lVar36 + local_4f0.nstride * local_390 + lVar27 + lVar28];
                                lVar35 = lVar35 + 1;
                              } while (uVar24 != (uint)lVar35);
                            }
                            lVar21 = lVar21 + 1;
                            lVar29 = lVar29 + local_4a8.jstride * 8;
                            lVar46 = lVar46 + lVar34;
                            lVar37 = lVar37 + lVar34;
                            lVar43 = lVar43 + lVar34;
                          } while (local_408 != (int)lVar21);
                        }
                        lVar41 = lVar41 + 1;
                        local_440 = local_440 + lVar20;
                        local_3a0 = local_3a0 + lVar20;
                        local_548 = local_548 + lVar20;
                      } while (local_410 != (int)lVar41);
                    }
                  }
                  else if ((int)local_4b0 <= (int)uVar5) {
                    local_548 = local_3d8 + local_468;
                    local_568 = ((local_420 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                 local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_548;
                    lVar20 = local_3f0 * local_3e8 * 8;
                    lVar34 = local_3e8 * 8;
                    local_560 = ((local_430 * lVar41 + local_2d8 + local_400 * -8) * local_3f0 +
                                 local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_548;
                    local_548 = ((lVar41 * local_428 + local_2d8 + local_400 * -8) * local_3f0 +
                                 local_2d0 + local_3f8 * -8) * local_3e8 + local_3e0 * -8 +
                                local_548;
                    lVar41 = local_2b8;
                    iVar18 = local_3b4;
                    do {
                      if (iVar8 <= iVar14) {
                        local_440 = (long)local_4f0.begin.y;
                        lVar43 = (long)local_4a8.p +
                                 local_4a8.nstride * local_538 +
                                 (local_398 - local_4a8.begin.y) * local_4a8.jstride * 8 +
                                 (lVar41 - local_4a8.begin.z) * local_4a8.kstride * 8 +
                                 (long)local_4a8.begin.x * -8 + local_468;
                        lVar46 = (long)local_4f0.p +
                                 local_4f0.nstride * local_538 +
                                 (local_398 - local_440) * local_4f0.jstride * 8 +
                                 (iVar18 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                 (long)local_4f0.begin.x * -8 + local_468;
                        uVar38 = local_568;
                        lVar21 = local_398;
                        lVar37 = local_548;
                        uVar44 = local_560;
                        do {
                          if ((int)local_3c0 <= (int)uVar15) {
                            lVar29 = 0;
                            do {
                              *(double *)(lVar46 + lVar29 * 8) =
                                   *(double *)(lVar43 + lVar29 * 8) * local_200 *
                                   (*(double *)(lVar37 + lVar29 * 8) /
                                   (*(double *)(uVar38 + lVar29 * 8) * local_2f0 +
                                   *(double *)(uVar44 + lVar29 * 8) * 0.5)) +
                                   *(double *)(lVar46 + lVar29 * 8);
                              lVar29 = lVar29 + 1;
                            } while (uVar24 != (uint)lVar29);
                          }
                          lVar21 = lVar21 + 1;
                          lVar43 = lVar43 + local_4a8.jstride * 8;
                          uVar38 = uVar38 + lVar34;
                          uVar44 = uVar44 + lVar34;
                          lVar37 = lVar37 + lVar34;
                          lVar46 = lVar46 + local_4f0.jstride * 8;
                        } while (local_408 != (int)lVar21);
                      }
                      lVar41 = lVar41 + 1;
                      local_568 = local_568 + lVar20;
                      local_560 = local_560 + lVar20;
                      local_548 = local_548 + lVar20;
                      iVar18 = iVar18 + 1;
                    } while (local_410 != (int)lVar41);
                  }
                }
              }
              local_538 = local_538 + 8;
              local_420 = local_420 + 0x18;
              local_430 = local_430 + 0x18;
              local_428 = local_428 + 0x18;
              uVar38 = local_390 + 1;
              lVar41 = local_438;
              local_3c8 = lVar42;
            } while (local_390 + 1 != local_158);
          }
          lVar42 = lVar42 + 1;
          local_448 = uVar32;
        } while (lVar42 != 3);
        MFIter::operator++(&local_108);
      } while (local_108.currentIndex < local_108.endIndex);
    }
    MFIter::~MFIter(&local_108);
    local_a8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
    BaseFab<double>::clear(&local_a8);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyInhomogNeumannTerm (int amrlev, Any& a_rhs) const
{
    bool has_inhomog_neumann = hasInhomogNeumannBC();
    bool has_robin = hasRobinBC();

    if (!has_inhomog_neumann && !has_robin) return;

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    MultiFab& rhs = a_rhs.get<MultiFab>();

    int ncomp = getNComp();
    const int mglev = 0;

    const auto problo = m_geom[amrlev][mglev].ProbLoArray();
    const auto probhi = m_geom[amrlev][mglev].ProbHiArray();
    amrex::ignore_unused(probhi);
    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);
    const Real xlo = problo[0];
    const Real dx = m_geom[amrlev][mglev].CellSize(0);
    const Box& domain = m_geom[amrlev][mglev].Domain();

    const Real beta = getBScalar();
    Array<MultiFab const*, AMREX_SPACEDIM> const& bcoef = getBCoeffs(amrlev,mglev);
    FArrayBox foo(Box(IntVect(0),IntVect(1)));
    bool has_bcoef = (bcoef[0] != nullptr);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];
    const auto& bndry = *m_bndry_sol[amrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rhs, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        Array4<Real> const& rhsfab = rhs.array(mfi);

        const auto & bdlv = bcondloc.bndryLocs(mfi);
        const auto & bdcv = bcondloc.bndryConds(mfi);

        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            Array4<Real const> const bfab = (has_bcoef)
                ? bcoef[idim]->const_array(mfi) : foo.const_array();
            const Orientation olo(idim,Orientation::low);
            const Orientation ohi(idim,Orientation::high);
            const Box blo = amrex::adjCellLo(vbx, idim);
            const Box bhi = amrex::adjCellHi(vbx, idim);
            const auto& mlo = maskvals[olo].array(mfi);
            const auto& mhi = maskvals[ohi].array(mfi);
            const auto& bvlo = bndry.bndryValues(olo).array(mfi);
            const auto& bvhi = bndry.bndryValues(ohi).array(mfi);
            bool outside_domain_lo = !(domain.contains(blo));
            bool outside_domain_hi = !(domain.contains(bhi));
            if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                const BoundCond bctlo = bdcv[icomp][olo];
                const BoundCond bcthi = bdcv[icomp][ohi];
                const Real bcllo = bdlv[icomp][olo];
                const Real bclhi = bdlv[icomp][ohi];
                if (m_lobc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_lo)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= problo[0]*problo[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= problo[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_xlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo_m(i,j,k, rhsfab, mlo,
                                                         bctlo, bcllo, bvlo,
                                                         fac, xlo, dx, icomp);
                            });
                        }
                        else {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo(i,j,k, rhsfab, mlo, bfab,
                                                       bctlo, bcllo, bvlo,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_zlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }
                if (m_hibc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_hi)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= probhi[0]*probhi[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= probhi[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_xhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi_m(i,j,k, rhsfab, mhi,
                                                         bcthi, bclhi, bvhi,
                                                         fac, xlo, dx, icomp);
                            });
                        } else {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi(i,j,k, rhsfab, mhi, bfab,
                                                       bcthi, bclhi, bvhi,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_zhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }

                if (has_robin) {
                    // For Robin BC, see comments in AMReX_MLABecLaplacian.cpp above
                    // function applyRobinBCTermsCoeffs.
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*A;
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        }
                    }
                }
            }
        }

    }
}